

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O0

void __thiscall
dtc::anon_unknown_1::ternary_conditional_operator::dump_impl(ternary_conditional_operator *this)

{
  pointer peVar1;
  ternary_conditional_operator *this_local;
  
  peVar1 = std::
           unique_ptr<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
           ::operator->(&this->cond);
  expression::dump(peVar1,false);
  std::operator<<((ostream *)&std::cerr," ? ");
  peVar1 = std::
           unique_ptr<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
           ::operator->(&this->lhs);
  expression::dump(peVar1,false);
  std::operator<<((ostream *)&std::cerr," : ");
  peVar1 = std::
           unique_ptr<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
           ::operator->(&this->rhs);
  expression::dump(peVar1,false);
  return;
}

Assistant:

void dump_impl() override
	{
		cond->dump();
		std::cerr << " ? ";
		lhs->dump();
		std::cerr << " : ";
		rhs->dump();
	}